

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O1

void __thiscall ASDCP::MXF::SourceClip::SourceClip(SourceClip *this,Dictionary *d)

{
  Dictionary *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  UMID *pUVar3;
  UL *pUVar4;
  MDDEntry *pMVar5;
  
  InterchangeObject::InterchangeObject((InterchangeObject *)this,d);
  (this->super_StructuralComponent).DataDefinition.super_Identifier<16U>.m_HasValue = false;
  (this->super_StructuralComponent).DataDefinition.super_Identifier<16U>.m_Value[0] = '\0';
  (this->super_StructuralComponent).DataDefinition.super_Identifier<16U>.m_Value[1] = '\0';
  (this->super_StructuralComponent).DataDefinition.super_Identifier<16U>.m_Value[2] = '\0';
  (this->super_StructuralComponent).DataDefinition.super_Identifier<16U>.m_Value[3] = '\0';
  (this->super_StructuralComponent).DataDefinition.super_Identifier<16U>.m_Value[4] = '\0';
  (this->super_StructuralComponent).DataDefinition.super_Identifier<16U>.m_Value[5] = '\0';
  (this->super_StructuralComponent).DataDefinition.super_Identifier<16U>.m_Value[6] = '\0';
  pUVar4 = &(this->super_StructuralComponent).DataDefinition;
  (pUVar4->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar4->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar4->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar4->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar4->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar4->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar4->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar4->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->super_StructuralComponent).DataDefinition.super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->super_StructuralComponent).DataDefinition.super_Identifier<16U>.super_IArchive.
  _vptr_IArchive = (_func_int **)&PTR__IArchive_0021f038;
  (this->super_StructuralComponent).Duration.m_has_value = false;
  (this->super_StructuralComponent).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__SourceClip_002254a8;
  this->StartPosition = 0;
  (this->SourcePackageID).super_Identifier<32U>.m_HasValue = false;
  (this->SourcePackageID).super_Identifier<32U>.m_Value[0] = '\0';
  (this->SourcePackageID).super_Identifier<32U>.m_Value[1] = '\0';
  (this->SourcePackageID).super_Identifier<32U>.m_Value[2] = '\0';
  (this->SourcePackageID).super_Identifier<32U>.m_Value[3] = '\0';
  (this->SourcePackageID).super_Identifier<32U>.m_Value[4] = '\0';
  (this->SourcePackageID).super_Identifier<32U>.m_Value[5] = '\0';
  (this->SourcePackageID).super_Identifier<32U>.m_Value[6] = '\0';
  pUVar3 = &this->SourcePackageID;
  (pUVar3->super_Identifier<32U>).m_Value[7] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[8] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[9] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[10] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[0xb] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[0xc] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[0xd] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[0xe] = '\0';
  pUVar3 = &this->SourcePackageID;
  (pUVar3->super_Identifier<32U>).m_Value[0xf] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[0x10] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[0x11] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[0x12] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[0x13] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[0x14] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[0x15] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[0x16] = '\0';
  pUVar3 = &this->SourcePackageID;
  (pUVar3->super_Identifier<32U>).m_Value[0x17] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[0x18] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[0x19] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[0x1a] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[0x1b] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[0x1c] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[0x1d] = '\0';
  (pUVar3->super_Identifier<32U>).m_Value[0x1e] = '\0';
  (this->SourcePackageID).super_Identifier<32U>.m_Value[0x1f] = '\0';
  (this->SourcePackageID).super_Identifier<32U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00227670;
  this->SourceTrackID = 0;
  this_00 = (this->super_StructuralComponent).super_InterchangeObject.m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar5 = Dictionary::Type(this_00,MDD_SourceClip);
    uVar1 = *(undefined8 *)pMVar5->ul;
    uVar2 = *(undefined8 *)(pMVar5->ul + 8);
    (this->super_StructuralComponent).super_InterchangeObject.super_KLVPacket.m_UL.
    super_Identifier<16U>.m_HasValue = true;
    *(undefined8 *)
     (this->super_StructuralComponent).super_InterchangeObject.super_KLVPacket.m_UL.
     super_Identifier<16U>.m_Value = uVar1;
    *(undefined8 *)
     ((this->super_StructuralComponent).super_InterchangeObject.super_KLVPacket.m_UL.
      super_Identifier<16U>.m_Value + 8) = uVar2;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x460,"ASDCP::MXF::SourceClip::SourceClip(const Dictionary *)");
}

Assistant:

SourceClip::SourceClip(const Dictionary* d) : StructuralComponent(d), StartPosition(0), SourceTrackID(0)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_SourceClip);
}